

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  undefined1 auVar42 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  float fVar48;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar56;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  float fVar64;
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [32];
  float fVar79;
  undefined1 auVar80 [32];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined1 auVar61 [16];
  
  auVar63._4_60_ = in_register_00001204;
  auVar63._0_4_ = scale;
  fVar13 = scale * r_scale0;
  pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = pBVar6[itime].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[itime].super_RawBufferView.stride;
  lVar41 = (uVar5 + 1) * sVar8;
  lVar40 = (uVar5 + 2) * sVar8;
  lVar39 = (uVar5 + 3) * sVar8;
  aVar4 = ofs->field_0;
  auVar52 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + uVar5 * sVar8),(undefined1  [16])aVar4);
  auVar66 = vshufps_avx(auVar63._0_16_,auVar63._0_16_,0);
  fVar74 = auVar66._0_4_;
  auVar42._0_4_ = fVar74 * auVar52._0_4_;
  fVar75 = auVar66._4_4_;
  auVar42._4_4_ = fVar75 * auVar52._4_4_;
  fVar76 = auVar66._8_4_;
  auVar42._8_4_ = fVar76 * auVar52._8_4_;
  fVar77 = auVar66._12_4_;
  auVar42._12_4_ = fVar77 * auVar52._12_4_;
  auVar66 = vshufps_avx(auVar42,auVar42,0);
  auVar52 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  fVar19 = (space->vx).field_0.m128[0];
  fVar20 = (space->vx).field_0.m128[1];
  fVar21 = (space->vx).field_0.m128[2];
  fVar22 = (space->vx).field_0.m128[3];
  fVar23 = (space->vy).field_0.m128[0];
  fVar24 = (space->vy).field_0.m128[1];
  fVar25 = (space->vy).field_0.m128[2];
  fVar26 = (space->vy).field_0.m128[3];
  fVar27 = (space->vz).field_0.m128[0];
  fVar28 = (space->vz).field_0.m128[1];
  fVar29 = (space->vz).field_0.m128[2];
  fVar30 = (space->vz).field_0.m128[3];
  auVar49._0_4_ = auVar66._0_4_ * fVar19 + fVar23 * auVar52._0_4_ + fVar27 * auVar42._0_4_;
  auVar49._4_4_ = auVar66._4_4_ * fVar20 + fVar24 * auVar52._4_4_ + fVar28 * auVar42._4_4_;
  auVar49._8_4_ = auVar66._8_4_ * fVar21 + fVar25 * auVar52._8_4_ + fVar29 * auVar42._8_4_;
  auVar49._12_4_ = auVar66._12_4_ * fVar22 + fVar26 * auVar52._12_4_ + fVar30 * auVar42._12_4_;
  fVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar14 = fVar13 * fVar3 * *(float *)(pcVar7 + uVar5 * sVar8 + 0xc);
  auVar66 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar41),(undefined1  [16])aVar4);
  auVar57._0_4_ = fVar74 * auVar66._0_4_;
  auVar57._4_4_ = fVar75 * auVar66._4_4_;
  auVar57._8_4_ = fVar76 * auVar66._8_4_;
  auVar57._12_4_ = fVar77 * auVar66._12_4_;
  auVar66 = vshufps_avx(auVar57,auVar57,0);
  auVar52 = vshufps_avx(auVar57,auVar57,0x55);
  auVar42 = vshufps_avx(auVar57,auVar57,0xaa);
  auVar61._0_4_ = auVar66._0_4_ * fVar19 + fVar23 * auVar52._0_4_ + fVar27 * auVar42._0_4_;
  auVar61._4_4_ = auVar66._4_4_ * fVar20 + fVar24 * auVar52._4_4_ + fVar28 * auVar42._4_4_;
  auVar61._8_4_ = auVar66._8_4_ * fVar21 + fVar25 * auVar52._8_4_ + fVar29 * auVar42._8_4_;
  auVar61._12_4_ = auVar66._12_4_ * fVar22 + fVar26 * auVar52._12_4_ + fVar30 * auVar42._12_4_;
  auVar63 = ZEXT1664(auVar61);
  fVar15 = fVar13 * fVar3 * *(float *)(pcVar7 + lVar41 + 0xc);
  auVar66 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar40),(undefined1  [16])aVar4);
  auVar65._0_4_ = fVar74 * auVar66._0_4_;
  auVar65._4_4_ = fVar75 * auVar66._4_4_;
  auVar65._8_4_ = fVar76 * auVar66._8_4_;
  auVar65._12_4_ = fVar77 * auVar66._12_4_;
  auVar66 = vshufps_avx(auVar65,auVar65,0);
  auVar52 = vshufps_avx(auVar65,auVar65,0x55);
  auVar42 = vshufps_avx(auVar65,auVar65,0xaa);
  auVar69._0_4_ = auVar66._0_4_ * fVar19 + fVar23 * auVar52._0_4_ + fVar27 * auVar42._0_4_;
  auVar69._4_4_ = auVar66._4_4_ * fVar20 + fVar24 * auVar52._4_4_ + fVar28 * auVar42._4_4_;
  auVar69._8_4_ = auVar66._8_4_ * fVar21 + fVar25 * auVar52._8_4_ + fVar29 * auVar42._8_4_;
  auVar69._12_4_ = auVar66._12_4_ * fVar22 + fVar26 * auVar52._12_4_ + fVar30 * auVar42._12_4_;
  fVar16 = fVar13 * fVar3 * *(float *)(pcVar7 + lVar40 + 0xc);
  fVar67 = 0.0;
  auVar66 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar39),(undefined1  [16])aVar4);
  auVar71._0_4_ = fVar74 * auVar66._0_4_;
  auVar71._4_4_ = fVar75 * auVar66._4_4_;
  auVar71._8_4_ = fVar76 * auVar66._8_4_;
  auVar71._12_4_ = fVar77 * auVar66._12_4_;
  auVar66 = vshufps_avx(auVar71,auVar71,0);
  auVar52 = vshufps_avx(auVar71,auVar71,0x55);
  auVar42 = vshufps_avx(auVar71,auVar71,0xaa);
  auVar72._0_4_ = fVar23 * auVar52._0_4_ + fVar27 * auVar42._0_4_ + auVar66._0_4_ * fVar19;
  auVar72._4_4_ = fVar24 * auVar52._4_4_ + fVar28 * auVar42._4_4_ + auVar66._4_4_ * fVar20;
  auVar72._8_4_ = fVar25 * auVar52._8_4_ + fVar29 * auVar42._8_4_ + auVar66._8_4_ * fVar21;
  auVar72._12_4_ = fVar26 * auVar52._12_4_ + fVar30 * auVar42._12_4_ + auVar66._12_4_ * fVar22;
  fVar13 = fVar3 * *(float *)(pcVar7 + lVar39 + 0xc) * fVar13;
  uVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          tessellationRate;
  lVar39 = (long)(int)uVar5;
  auVar66 = ZEXT416((uint)fVar16);
  if (lVar39 == 4) {
    auVar42 = vshufps_avx(auVar72,auVar72,0);
    auVar57 = vshufps_avx(auVar72,auVar72,0x55);
    auVar65 = vshufps_avx(auVar72,auVar72,0xaa);
    auVar71 = vshufps_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),0);
    auVar72 = vshufps_avx(auVar69,auVar69,0);
    auVar44 = vshufps_avx(auVar69,auVar69,0x55);
    auVar52 = vinsertps_avx(auVar69,ZEXT416((uint)fVar16),0x30);
    auVar69 = vshufps_avx(auVar69,auVar69,0xaa);
    auVar51 = vshufps_avx(ZEXT416((uint)fVar16),auVar66,0);
    auVar66 = vshufps_avx(auVar61,auVar61,0);
    auVar43 = vshufps_avx(auVar61,auVar61,0x55);
    auVar61 = vshufps_avx(auVar61,auVar61,0xaa);
    auVar50 = vshufps_avx(auVar49,auVar49,0);
    auVar58 = vshufps_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15),0);
    auVar17 = vshufps_avx(auVar49,auVar49,0x55);
    auVar49 = vshufps_avx(auVar49,auVar49,0xaa);
    auVar18 = vshufps_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),0);
    auVar68._0_4_ =
         auVar66._0_4_ * (float)catmullrom_basis0._1428_4_ +
         auVar42._0_4_ * (float)catmullrom_basis0._3740_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar72._0_4_ +
         (float)catmullrom_basis0._272_4_ * auVar50._0_4_;
    auVar68._4_4_ =
         auVar66._4_4_ * (float)catmullrom_basis0._1432_4_ +
         auVar42._4_4_ * (float)catmullrom_basis0._3744_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar72._4_4_ +
         (float)catmullrom_basis0._276_4_ * auVar50._4_4_;
    auVar68._8_4_ =
         auVar66._8_4_ * (float)catmullrom_basis0._1436_4_ +
         auVar42._8_4_ * (float)catmullrom_basis0._3748_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar72._8_4_ +
         (float)catmullrom_basis0._280_4_ * auVar50._8_4_;
    auVar68._12_4_ =
         auVar66._12_4_ * (float)catmullrom_basis0._1440_4_ +
         auVar42._12_4_ * (float)catmullrom_basis0._3752_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar72._12_4_ +
         (float)catmullrom_basis0._284_4_ * auVar50._12_4_;
    auVar70._0_4_ =
         auVar43._0_4_ * (float)catmullrom_basis0._1428_4_ +
         auVar57._0_4_ * (float)catmullrom_basis0._3740_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar44._0_4_ +
         auVar17._0_4_ * (float)catmullrom_basis0._272_4_;
    auVar70._4_4_ =
         auVar43._4_4_ * (float)catmullrom_basis0._1432_4_ +
         auVar57._4_4_ * (float)catmullrom_basis0._3744_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar44._4_4_ +
         auVar17._4_4_ * (float)catmullrom_basis0._276_4_;
    auVar70._8_4_ =
         auVar43._8_4_ * (float)catmullrom_basis0._1436_4_ +
         auVar57._8_4_ * (float)catmullrom_basis0._3748_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar44._8_4_ +
         auVar17._8_4_ * (float)catmullrom_basis0._280_4_;
    auVar70._12_4_ =
         auVar43._12_4_ * (float)catmullrom_basis0._1440_4_ +
         auVar57._12_4_ * (float)catmullrom_basis0._3752_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar44._12_4_ +
         auVar17._12_4_ * (float)catmullrom_basis0._284_4_;
    auVar50._0_4_ =
         (float)catmullrom_basis0._272_4_ * auVar49._0_4_ +
         (float)catmullrom_basis0._1428_4_ * auVar61._0_4_ +
         auVar65._0_4_ * (float)catmullrom_basis0._3740_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar69._0_4_;
    auVar50._4_4_ =
         (float)catmullrom_basis0._276_4_ * auVar49._4_4_ +
         (float)catmullrom_basis0._1432_4_ * auVar61._4_4_ +
         auVar65._4_4_ * (float)catmullrom_basis0._3744_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar69._4_4_;
    auVar50._8_4_ =
         (float)catmullrom_basis0._280_4_ * auVar49._8_4_ +
         (float)catmullrom_basis0._1436_4_ * auVar61._8_4_ +
         auVar65._8_4_ * (float)catmullrom_basis0._3748_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar69._8_4_;
    auVar50._12_4_ =
         (float)catmullrom_basis0._284_4_ * auVar49._12_4_ +
         (float)catmullrom_basis0._1440_4_ * auVar61._12_4_ +
         auVar65._12_4_ * (float)catmullrom_basis0._3752_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar69._12_4_;
    auVar43._0_4_ =
         (float)catmullrom_basis0._272_4_ * auVar18._0_4_ +
         (float)catmullrom_basis0._1428_4_ * auVar58._0_4_ +
         (float)catmullrom_basis0._2584_4_ * auVar51._0_4_ +
         auVar71._0_4_ * (float)catmullrom_basis0._3740_4_;
    auVar43._4_4_ =
         (float)catmullrom_basis0._276_4_ * auVar18._4_4_ +
         (float)catmullrom_basis0._1432_4_ * auVar58._4_4_ +
         (float)catmullrom_basis0._2588_4_ * auVar51._4_4_ +
         auVar71._4_4_ * (float)catmullrom_basis0._3744_4_;
    auVar43._8_4_ =
         (float)catmullrom_basis0._280_4_ * auVar18._8_4_ +
         (float)catmullrom_basis0._1436_4_ * auVar58._8_4_ +
         (float)catmullrom_basis0._2592_4_ * auVar51._8_4_ +
         auVar71._8_4_ * (float)catmullrom_basis0._3748_4_;
    auVar43._12_4_ =
         (float)catmullrom_basis0._284_4_ * auVar18._12_4_ +
         (float)catmullrom_basis0._1440_4_ * auVar58._12_4_ +
         (float)catmullrom_basis0._2596_4_ * auVar51._12_4_ +
         auVar71._12_4_ * (float)catmullrom_basis0._3752_4_;
    auVar57 = vshufps_avx(auVar68,auVar68,0xb1);
    auVar66 = vminps_avx(auVar57,auVar68);
    auVar42 = vshufpd_avx(auVar66,auVar66,1);
    auVar66 = vminps_avx(auVar42,auVar66);
    auVar61 = vshufps_avx(auVar70,auVar70,0xb1);
    auVar42 = vminps_avx(auVar61,auVar70);
    auVar49 = vshufpd_avx(auVar42,auVar42,1);
    auVar42 = vminps_avx(auVar49,auVar42);
    auVar66 = vinsertps_avx(auVar66,auVar42,0x1c);
    auVar65 = vshufps_avx(auVar50,auVar50,0xb1);
    auVar42 = vminps_avx(auVar65,auVar50);
    auVar49 = vshufpd_avx(auVar42,auVar42,1);
    auVar42 = vminps_avx(auVar49,auVar42);
    auVar42 = vinsertps_avx(auVar66,auVar42,0x20);
    auVar66 = vmaxps_avx(auVar57,auVar68);
    auVar49 = vshufpd_avx(auVar66,auVar66,1);
    auVar66 = vmaxps_avx(auVar49,auVar66);
    auVar49 = vmaxps_avx(auVar61,auVar70);
    auVar57 = vshufpd_avx(auVar49,auVar49,1);
    auVar49 = vmaxps_avx(auVar57,auVar49);
    auVar66 = vinsertps_avx(auVar66,auVar49,0x1c);
    auVar49 = vmaxps_avx(auVar65,auVar50);
    auVar57 = vshufpd_avx(auVar49,auVar49,1);
    auVar49 = vmaxps_avx(auVar57,auVar49);
    auVar49 = vinsertps_avx(auVar66,auVar49,0x20);
    auVar58._8_4_ = 0x7fffffff;
    auVar58._0_8_ = 0x7fffffff7fffffff;
    auVar58._12_4_ = 0x7fffffff;
    auVar66 = vandps_avx(auVar43,auVar58);
    auVar57 = vshufps_avx(auVar66,auVar66,0xb1);
    auVar66 = vmaxps_avx(auVar57,auVar66);
    auVar57 = vshufps_avx(auVar66,auVar66,0);
    auVar66 = vshufps_avx(auVar66,auVar66,0xaa);
    auVar57 = vmaxps_avx(auVar66,auVar57);
    auVar61 = vminps_avx(auVar42,auVar52);
    auVar52 = vmaxps_avx(auVar49,auVar52);
    auVar66 = vandps_avx(auVar51,auVar58);
    auVar42 = vmaxps_avx(auVar57,auVar66);
    auVar66 = vsubps_avx(auVar61,auVar42);
    auVar44._0_4_ = auVar52._0_4_ + auVar42._0_4_;
    auVar44._4_4_ = auVar52._4_4_ + auVar42._4_4_;
    auVar44._8_4_ = auVar52._8_4_ + auVar42._8_4_;
    auVar44._12_4_ = auVar52._12_4_ + auVar42._12_4_;
  }
  else {
    auVar52 = vpshufd_avx(ZEXT416(uVar5),0);
    auVar42 = vshufps_avx(auVar49,auVar49,0);
    auVar57 = vshufps_avx(auVar49,auVar49,0x55);
    auVar49 = vshufps_avx(auVar49,auVar49,0xaa);
    auVar65 = vshufps_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),0);
    auVar71 = vshufps_avx(auVar61,auVar61,0);
    auVar44 = vshufps_avx(auVar61,auVar61,0x55);
    auVar61 = vshufps_avx(auVar61,auVar61,0xaa);
    auVar51 = vshufps_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15),0);
    auVar43 = vshufps_avx(auVar69,auVar69,0);
    auVar50 = vshufps_avx(auVar69,auVar69,0x55);
    auVar69 = vshufps_avx(auVar69,auVar69,0xaa);
    auVar66 = vshufps_avx(auVar66,auVar66,0);
    auVar58 = vshufps_avx(auVar72,auVar72,0);
    auVar55 = ZEXT1664(auVar58);
    auVar17 = vshufps_avx(auVar72,auVar72,0x55);
    auVar72 = vshufps_avx(auVar72,auVar72,0xaa);
    auVar45._16_16_ = auVar72;
    auVar45._0_16_ = auVar72;
    auVar18 = vshufps_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),0);
    lVar40 = lVar39 * 0x44;
    auVar73._8_4_ = 0x7f800000;
    auVar73._0_8_ = 0x7f8000007f800000;
    auVar73._12_4_ = 0x7f800000;
    auVar73._16_4_ = 0x7f800000;
    auVar73._20_4_ = 0x7f800000;
    auVar73._24_4_ = 0x7f800000;
    auVar73._28_4_ = 0x7f800000;
    auVar80._8_4_ = 0xff800000;
    auVar80._0_8_ = 0xff800000ff800000;
    auVar80._12_4_ = 0xff800000;
    auVar80._16_4_ = 0xff800000;
    auVar80._20_4_ = 0xff800000;
    auVar80._24_4_ = 0xff800000;
    auVar80._28_4_ = 0xff800000;
    auVar60 = ZEXT864(0) << 0x20;
    auVar9 = auVar73;
    auVar10 = auVar73;
    auVar11 = auVar80;
    auVar12 = auVar80;
    for (lVar41 = 0; auVar59 = auVar60._0_32_, lVar41 <= lVar39; lVar41 = lVar41 + 8) {
      auVar70 = vpshufd_avx(ZEXT416((uint)lVar41),0);
      auVar68 = vpor_avx(auVar70,_DAT_01f4ad30);
      auVar70 = vpor_avx(auVar70,_DAT_01f7afa0);
      auVar68 = vpcmpgtd_avx(auVar68,auVar52);
      auVar70 = vpcmpgtd_avx(auVar70,auVar52);
      auVar78._16_16_ = auVar70;
      auVar78._0_16_ = auVar68;
      pfVar1 = (float *)(lVar40 + 0x2204c74 + lVar41 * 4);
      fVar3 = *pfVar1;
      fVar14 = pfVar1[1];
      fVar15 = pfVar1[2];
      fVar16 = pfVar1[3];
      fVar13 = pfVar1[4];
      fVar19 = pfVar1[5];
      fVar20 = pfVar1[6];
      pfVar2 = (float *)(lVar40 + 0x22050f8 + lVar41 * 4);
      fVar21 = *pfVar2;
      fVar22 = pfVar2[1];
      fVar23 = pfVar2[2];
      fVar24 = pfVar2[3];
      fVar25 = pfVar2[4];
      fVar26 = pfVar2[5];
      fVar27 = pfVar2[6];
      fVar28 = pfVar2[7];
      local_1a8 = auVar58._0_4_;
      fStack_1a4 = auVar58._4_4_;
      fStack_1a0 = auVar58._8_4_;
      fStack_19c = auVar58._12_4_;
      local_1c8 = auVar17._0_4_;
      fStack_1c4 = auVar17._4_4_;
      fStack_1c0 = auVar17._8_4_;
      fStack_1bc = auVar17._12_4_;
      local_1e8 = auVar72._0_4_;
      fStack_1e4 = auVar72._4_4_;
      fStack_1e0 = auVar72._8_4_;
      fStack_1dc = auVar72._12_4_;
      local_128 = auVar43._0_4_;
      fStack_124 = auVar43._4_4_;
      fStack_120 = auVar43._8_4_;
      fStack_11c = auVar43._12_4_;
      fVar48 = fVar67 + auVar45._28_4_;
      local_148 = auVar50._0_4_;
      fStack_144 = auVar50._4_4_;
      fStack_140 = auVar50._8_4_;
      fStack_13c = auVar50._12_4_;
      fVar56 = fVar67 + auVar55._28_4_;
      local_168 = auVar69._0_4_;
      fStack_164 = auVar69._4_4_;
      fStack_160 = auVar69._8_4_;
      fStack_15c = auVar69._12_4_;
      fVar64 = fVar67 + auVar63._28_4_;
      pfVar2 = (float *)(lVar40 + 0x22047f0 + lVar41 * 4);
      fVar29 = *pfVar2;
      fVar30 = pfVar2[1];
      fVar74 = pfVar2[2];
      fVar75 = pfVar2[3];
      fVar76 = pfVar2[4];
      fVar77 = pfVar2[5];
      fVar31 = pfVar2[6];
      local_188 = auVar66._0_4_;
      fStack_184 = auVar66._4_4_;
      fStack_180 = auVar66._8_4_;
      fStack_17c = auVar66._12_4_;
      fVar79 = pfVar1[7] + fVar28;
      local_a8 = auVar71._0_4_;
      fStack_a4 = auVar71._4_4_;
      fStack_a0 = auVar71._8_4_;
      fStack_9c = auVar71._12_4_;
      local_c8 = auVar44._0_4_;
      fStack_c4 = auVar44._4_4_;
      fStack_c0 = auVar44._8_4_;
      fStack_bc = auVar44._12_4_;
      local_e8 = auVar61._0_4_;
      fStack_e4 = auVar61._4_4_;
      fStack_e0 = auVar61._8_4_;
      fStack_dc = auVar61._12_4_;
      pfVar1 = (float *)(catmullrom_basis0 + lVar41 * 4 + lVar40);
      fVar32 = *pfVar1;
      fVar33 = pfVar1[1];
      fVar34 = pfVar1[2];
      fVar35 = pfVar1[3];
      fVar36 = pfVar1[4];
      fVar37 = pfVar1[5];
      fVar38 = pfVar1[6];
      local_108 = auVar51._0_4_;
      fStack_104 = auVar51._4_4_;
      fStack_100 = auVar51._8_4_;
      fStack_fc = auVar51._12_4_;
      fVar67 = fVar79 + pfVar2[7];
      local_28 = auVar42._0_4_;
      fStack_24 = auVar42._4_4_;
      fStack_20 = auVar42._8_4_;
      fStack_1c = auVar42._12_4_;
      auVar46._0_4_ = fVar32 * local_28 + fVar29 * local_a8 + fVar3 * local_128 + fVar21 * local_1a8
      ;
      auVar46._4_4_ =
           fVar33 * fStack_24 + fVar30 * fStack_a4 + fVar14 * fStack_124 + fVar22 * fStack_1a4;
      auVar46._8_4_ =
           fVar34 * fStack_20 + fVar74 * fStack_a0 + fVar15 * fStack_120 + fVar23 * fStack_1a0;
      auVar46._12_4_ =
           fVar35 * fStack_1c + fVar75 * fStack_9c + fVar16 * fStack_11c + fVar24 * fStack_19c;
      auVar46._16_4_ =
           fVar36 * local_28 + fVar76 * local_a8 + fVar13 * local_128 + fVar25 * local_1a8;
      auVar46._20_4_ =
           fVar37 * fStack_24 + fVar77 * fStack_a4 + fVar19 * fStack_124 + fVar26 * fStack_1a4;
      auVar46._24_4_ =
           fVar38 * fStack_20 + fVar31 * fStack_a0 + fVar20 * fStack_120 + fVar27 * fStack_1a0;
      auVar46._28_4_ = fVar79 + fVar28 + fVar48;
      local_48 = auVar57._0_4_;
      fStack_44 = auVar57._4_4_;
      fStack_40 = auVar57._8_4_;
      fStack_3c = auVar57._12_4_;
      auVar53._0_4_ = fVar32 * local_48 + fVar29 * local_c8 + fVar3 * local_148 + fVar21 * local_1c8
      ;
      auVar53._4_4_ =
           fVar33 * fStack_44 + fVar30 * fStack_c4 + fVar14 * fStack_144 + fVar22 * fStack_1c4;
      auVar53._8_4_ =
           fVar34 * fStack_40 + fVar74 * fStack_c0 + fVar15 * fStack_140 + fVar23 * fStack_1c0;
      auVar53._12_4_ =
           fVar35 * fStack_3c + fVar75 * fStack_bc + fVar16 * fStack_13c + fVar24 * fStack_1bc;
      auVar53._16_4_ =
           fVar36 * local_48 + fVar76 * local_c8 + fVar13 * local_148 + fVar25 * local_1c8;
      auVar53._20_4_ =
           fVar37 * fStack_44 + fVar77 * fStack_c4 + fVar19 * fStack_144 + fVar26 * fStack_1c4;
      auVar53._24_4_ =
           fVar38 * fStack_40 + fVar31 * fStack_c0 + fVar20 * fStack_140 + fVar27 * fStack_1c0;
      auVar53._28_4_ = fVar79 + fVar28 + fVar56;
      auVar45 = vminps_avx(auVar9,auVar46);
      auVar9 = vblendvps_avx(auVar45,auVar9,auVar78);
      auVar45 = vminps_avx(auVar73,auVar53);
      auVar73 = vblendvps_avx(auVar45,auVar73,auVar78);
      local_68 = auVar49._0_4_;
      fStack_64 = auVar49._4_4_;
      fStack_60 = auVar49._8_4_;
      fStack_5c = auVar49._12_4_;
      auVar62._0_4_ = fVar32 * local_68 + fVar29 * local_e8 + fVar3 * local_168 + fVar21 * local_1e8
      ;
      auVar62._4_4_ =
           fVar33 * fStack_64 + fVar30 * fStack_e4 + fVar14 * fStack_164 + fVar22 * fStack_1e4;
      auVar62._8_4_ =
           fVar34 * fStack_60 + fVar74 * fStack_e0 + fVar15 * fStack_160 + fVar23 * fStack_1e0;
      auVar62._12_4_ =
           fVar35 * fStack_5c + fVar75 * fStack_dc + fVar16 * fStack_15c + fVar24 * fStack_1dc;
      auVar62._16_4_ =
           fVar36 * local_68 + fVar76 * local_e8 + fVar13 * local_168 + fVar25 * local_1e8;
      auVar62._20_4_ =
           fVar37 * fStack_64 + fVar77 * fStack_e4 + fVar19 * fStack_164 + fVar26 * fStack_1e4;
      auVar62._24_4_ =
           fVar38 * fStack_60 + fVar31 * fStack_e0 + fVar20 * fStack_160 + fVar27 * fStack_1e0;
      auVar62._28_4_ = auVar45._28_4_ + fVar28 + fVar64;
      auVar63 = ZEXT3264(auVar62);
      auVar45 = vminps_avx(auVar10,auVar62);
      auVar10 = vblendvps_avx(auVar45,auVar10,auVar78);
      auVar45 = vmaxps_avx(auVar11,auVar46);
      auVar11 = vblendvps_avx(auVar45,auVar11,auVar78);
      local_88 = auVar65._0_4_;
      fStack_84 = auVar65._4_4_;
      fStack_80 = auVar65._8_4_;
      fStack_7c = auVar65._12_4_;
      auVar47._0_4_ =
           fVar32 * local_88 + fVar3 * local_188 + fVar21 * auVar18._0_4_ + fVar29 * local_108;
      auVar47._4_4_ =
           fVar33 * fStack_84 + fVar14 * fStack_184 + fVar22 * auVar18._4_4_ + fVar30 * fStack_104;
      auVar47._8_4_ =
           fVar34 * fStack_80 + fVar15 * fStack_180 + fVar23 * auVar18._8_4_ + fVar74 * fStack_100;
      auVar47._12_4_ =
           fVar35 * fStack_7c + fVar16 * fStack_17c + fVar24 * auVar18._12_4_ + fVar75 * fStack_fc;
      auVar47._16_4_ =
           fVar36 * local_88 + fVar13 * local_188 + fVar25 * auVar18._0_4_ + fVar76 * local_108;
      auVar47._20_4_ =
           fVar37 * fStack_84 + fVar19 * fStack_184 + fVar26 * auVar18._4_4_ + fVar77 * fStack_104;
      auVar47._24_4_ =
           fVar38 * fStack_80 + fVar20 * fStack_180 + fVar27 * auVar18._8_4_ + fVar31 * fStack_100;
      auVar47._28_4_ = auVar45._28_4_ + fVar67;
      auVar45 = vmaxps_avx(auVar12,auVar53);
      auVar12 = vblendvps_avx(auVar45,auVar12,auVar78);
      auVar45 = vmaxps_avx(auVar80,auVar62);
      auVar80 = vblendvps_avx(auVar45,auVar80,auVar78);
      auVar54._8_4_ = 0x7fffffff;
      auVar54._0_8_ = 0x7fffffff7fffffff;
      auVar54._12_4_ = 0x7fffffff;
      auVar54._16_4_ = 0x7fffffff;
      auVar54._20_4_ = 0x7fffffff;
      auVar54._24_4_ = 0x7fffffff;
      auVar54._28_4_ = 0x7fffffff;
      auVar55 = ZEXT3264(auVar54);
      auVar45 = vandps_avx(auVar47,auVar54);
      auVar45 = vmaxps_avx(auVar59,auVar45);
      auVar59 = vblendvps_avx(auVar45,auVar59,auVar78);
      auVar60 = ZEXT3264(auVar59);
    }
    auVar45 = vshufps_avx(auVar9,auVar9,0xb1);
    auVar9 = vminps_avx(auVar9,auVar45);
    auVar45 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vminps_avx(auVar9,auVar45);
    auVar66 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar9 = vshufps_avx(auVar73,auVar73,0xb1);
    auVar9 = vminps_avx(auVar73,auVar9);
    auVar73 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vminps_avx(auVar9,auVar73);
    auVar52 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar52 = vunpcklps_avx(auVar66,auVar52);
    auVar9 = vshufps_avx(auVar10,auVar10,0xb1);
    auVar9 = vminps_avx(auVar10,auVar9);
    auVar73 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vminps_avx(auVar9,auVar73);
    auVar66 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar66 = vinsertps_avx(auVar52,auVar66,0x28);
    auVar9 = vshufps_avx(auVar11,auVar11,0xb1);
    auVar9 = vmaxps_avx(auVar11,auVar9);
    auVar73 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar73);
    auVar52 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar9 = vshufps_avx(auVar12,auVar12,0xb1);
    auVar9 = vmaxps_avx(auVar12,auVar9);
    auVar73 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar73);
    auVar42 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar42 = vunpcklps_avx(auVar52,auVar42);
    auVar9 = vshufps_avx(auVar80,auVar80,0xb1);
    auVar9 = vmaxps_avx(auVar80,auVar9);
    auVar73 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar73);
    auVar52 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar52 = vinsertps_avx(auVar42,auVar52,0x28);
    auVar9 = vshufps_avx(auVar59,auVar59,0xb1);
    auVar9 = vmaxps_avx(auVar59,auVar9);
    auVar73 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar73);
    auVar42 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar42 = vshufps_avx(auVar42,auVar42,0);
    auVar66 = vsubps_avx(auVar66,auVar42);
    auVar44._0_4_ = auVar52._0_4_ + auVar42._0_4_;
    auVar44._4_4_ = auVar52._4_4_ + auVar42._4_4_;
    auVar44._8_4_ = auVar52._8_4_ + auVar42._8_4_;
    auVar44._12_4_ = auVar52._12_4_ + auVar42._12_4_;
  }
  auVar51._8_4_ = 0x7fffffff;
  auVar51._0_8_ = 0x7fffffff7fffffff;
  auVar51._12_4_ = 0x7fffffff;
  auVar52 = vandps_avx(auVar66,auVar51);
  auVar42 = vandps_avx(auVar44,auVar51);
  auVar52 = vmaxps_avx(auVar52,auVar42);
  auVar42 = vmovshdup_avx(auVar52);
  auVar42 = vmaxss_avx(auVar42,auVar52);
  auVar52 = vshufpd_avx(auVar52,auVar52,1);
  auVar52 = vmaxss_avx(auVar52,auVar42);
  auVar52 = ZEXT416((uint)(auVar52._0_4_ * 4.7683716e-07));
  auVar52 = vshufps_avx(auVar52,auVar52,0);
  aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar66,auVar52);
  (__return_storage_ptr__->lower).field_0 = aVar4;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar44._0_4_ + auVar52._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar44._4_4_ + auVar52._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar44._8_4_ + auVar52._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar44._12_4_ + auVar52._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }